

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::visitConstantUnion
          (TGlslangToSpvTraverser *this,TIntermConstantUnion *node)

{
  uint in_EAX;
  int iVar1;
  Id IVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int nextConst;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(node);
  if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0xf) & 0x10) == 0) {
    uStack_28 = (ulong)(uint)uStack_28;
    iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    IVar2 = createSpvConstantFromConstUnionArray
                      (this,(TType *)CONCAT44(extraout_var_00,iVar1),&node->constArray,
                       (int *)((long)&uStack_28 + 4),false);
    spv::Builder::clearAccessChain(&this->builder);
    (this->builder).accessChain.isRValue = true;
    (this->builder).accessChain.base = IVar2;
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::visitConstantUnion(glslang::TIntermConstantUnion* node)
{
    if (node->getQualifier().isSpirvLiteral())
        return; // Translated to a literal value, skip further processing

    int nextConst = 0;
    spv::Id constant = createSpvConstantFromConstUnionArray(node->getType(), node->getConstArray(), nextConst, false);

    builder.clearAccessChain();
    builder.setAccessChainRValue(constant);
}